

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.hpp
# Opt level: O1

void __thiscall History::set_last_cmd(History *this,string *sess_id,string *cwd,string *cmd)

{
  Query query;
  Query local_58;
  
  local_58.db = &this->db;
  local_58.stmt._M_t.super___uniq_ptr_impl<sqlite3_stmt,_std::function<void_(sqlite3_stmt_*)>_>._M_t
  .super__Tuple_impl<0UL,_sqlite3_stmt_*,_std::function<void_(sqlite3_stmt_*)>_>.
  super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl =
       sqlite::Database::prepare_sql(local_58.db,&(this->lcSch).insertOrReplace);
  local_58.stmt._M_t.super___uniq_ptr_impl<sqlite3_stmt,_std::function<void_(sqlite3_stmt_*)>_>._M_t
  .super__Tuple_impl<0UL,_sqlite3_stmt_*,_std::function<void_(sqlite3_stmt_*)>_>.
  super__Tuple_impl<1UL,_std::function<void_(sqlite3_stmt_*)>_>.
  super__Head_base<1UL,_std::function<void_(sqlite3_stmt_*)>,_false>._M_head_impl._M_invoker =
       std::
       _Function_handler<void_(sqlite3_stmt_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dkolmakov[P]hm/src/././query.hpp:36:44)>
       ::_M_invoke;
  local_58.stmt._M_t.super___uniq_ptr_impl<sqlite3_stmt,_std::function<void_(sqlite3_stmt_*)>_>._M_t
  .super__Tuple_impl<0UL,_sqlite3_stmt_*,_std::function<void_(sqlite3_stmt_*)>_>.
  super__Tuple_impl<1UL,_std::function<void_(sqlite3_stmt_*)>_>.
  super__Head_base<1UL,_std::function<void_(sqlite3_stmt_*)>,_false>._M_head_impl.
  super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_58.stmt._M_t.super___uniq_ptr_impl<sqlite3_stmt,_std::function<void_(sqlite3_stmt_*)>_>._M_t
  .super__Tuple_impl<0UL,_sqlite3_stmt_*,_std::function<void_(sqlite3_stmt_*)>_>.
  super__Tuple_impl<1UL,_std::function<void_(sqlite3_stmt_*)>_>.
  super__Head_base<1UL,_std::function<void_(sqlite3_stmt_*)>,_false>._M_head_impl.
  super__Function_base._M_functor._8_8_ = 0;
  local_58.stmt._M_t.super___uniq_ptr_impl<sqlite3_stmt,_std::function<void_(sqlite3_stmt_*)>_>._M_t
  .super__Tuple_impl<0UL,_sqlite3_stmt_*,_std::function<void_(sqlite3_stmt_*)>_>.
  super__Tuple_impl<1UL,_std::function<void_(sqlite3_stmt_*)>_>.
  super__Head_base<1UL,_std::function<void_(sqlite3_stmt_*)>,_false>._M_head_impl.
  super__Function_base._M_manager =
       std::
       _Function_handler<void_(sqlite3_stmt_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dkolmakov[P]hm/src/././query.hpp:36:44)>
       ::_M_manager;
  sqlite::Database::bind_value
            (local_58.db,
             local_58.stmt._M_t.
             super___uniq_ptr_impl<sqlite3_stmt,_std::function<void_(sqlite3_stmt_*)>_>._M_t.
             super__Tuple_impl<0UL,_sqlite3_stmt_*,_std::function<void_(sqlite3_stmt_*)>_>.
             super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl,
             &(this->lcSch).super_LastCommandsSchemaColumnsList.sess_id.super_ColumnBase.bName,
             sess_id);
  sqlite::Database::bind_value
            (local_58.db,
             local_58.stmt._M_t.
             super___uniq_ptr_impl<sqlite3_stmt,_std::function<void_(sqlite3_stmt_*)>_>._M_t.
             super__Tuple_impl<0UL,_sqlite3_stmt_*,_std::function<void_(sqlite3_stmt_*)>_>.
             super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl,
             &(this->lcSch).super_LastCommandsSchemaColumnsList.pwd.super_ColumnBase.bName,cwd);
  sqlite::Database::bind_value
            (local_58.db,
             local_58.stmt._M_t.
             super___uniq_ptr_impl<sqlite3_stmt,_std::function<void_(sqlite3_stmt_*)>_>._M_t.
             super__Tuple_impl<0UL,_sqlite3_stmt_*,_std::function<void_(sqlite3_stmt_*)>_>.
             super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl,
             &(this->lcSch).super_LastCommandsSchemaColumnsList.cmd.super_ColumnBase.bName,cmd);
  sqlite::Query::exec(&local_58);
  std::unique_ptr<sqlite3_stmt,_std::function<void_(sqlite3_stmt_*)>_>::~unique_ptr(&local_58.stmt);
  return;
}

Assistant:

void set_last_cmd(const std::string& sess_id, const std::string& cwd,
                    const std::string& cmd) {
    sqlite::Query query(db, lcSch.insertOrReplace);

    query.bind(lcSch.sess_id.bName,
               sess_id);  // TODO(dkolmakov): Implement type safe binding
    query.bind(lcSch.pwd.bName, cwd);
    query.bind(lcSch.cmd.bName, cmd);
    query.exec();
  }